

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

fourcc_t NodeEnumClassFilterRated
                   (anynode *AnyContext,array *ListId,fourcc_t ClassId,nodeenumclassfilterrated Func
                   ,void *Param)

{
  long lVar1;
  ulong uVar2;
  bool_t bVar3;
  int local_ac;
  size_t Count;
  nodeclassrated *b;
  fourcc_t *a;
  nodeclassrated Item;
  int Rating;
  int BestRate;
  int BestPri;
  fourcc_t BestId;
  array List;
  nodeclass **i;
  nodeclass *v;
  nodecontext *p;
  void *Param_local;
  nodeenumclassfilterrated Func_local;
  fourcc_t ClassId_local;
  array *ListId_local;
  anynode *AnyContext_local;
  
  BestRate = 0;
  Rating = 0;
  Item._12_4_ = 0;
  if (AnyContext == (anynode *)0x0) {
    __assert_fail("AnyContext != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x678,
                  "fourcc_t NodeEnumClassFilterRated(anynode *, array *, fourcc_t, nodeenumclassfilterrated, void *)"
                 );
  }
  if (AnyContext == (anynode *)0x0) {
    __assert_fail("(const void*)(AnyContext)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x679,
                  "fourcc_t NodeEnumClassFilterRated(anynode *, array *, fourcc_t, nodeenumclassfilterrated, void *)"
                 );
  }
  lVar1 = **(long **)((long)AnyContext + 8);
  _BestPri = (char *)0x0;
  List._Begin = (char *)0x0;
  if (lVar1 == -0x70) {
    __assert_fail("&(p->NodeClass)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x67d,
                  "fourcc_t NodeEnumClassFilterRated(anynode *, array *, fourcc_t, nodeenumclassfilterrated, void *)"
                 );
  }
  List._Used = *(size_t *)(lVar1 + 0x70);
  do {
    if (lVar1 == -0x70) {
      __assert_fail("&(p->NodeClass)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x67d,
                    "fourcc_t NodeEnumClassFilterRated(anynode *, array *, fourcc_t, nodeenumclassfilterrated, void *)"
                   );
    }
    if (List._Used == *(long *)(lVar1 + 0x70) + (*(ulong *)(lVar1 + 0x78) & 0xfffffffffffffff8)) {
      if (ListId != (array *)0x0) {
        uVar2 = (ulong)List._Begin >> 4;
        ArraySortEx((array *)&BestPri,(ulong)List._Begin >> 4,0x10,CmpRatedClassPri,(void *)0x0,0);
        ListId->_Begin = (char *)0x0;
        ListId->_Used = 0;
        bVar3 = ArrayAppend(ListId,(void *)0x0,uVar2 << 2,0x40);
        if (bVar3 != 0) {
          if (ListId == (array *)0x0) {
            __assert_fail("&(*ListId)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                          ,0x6a7,
                          "fourcc_t NodeEnumClassFilterRated(anynode *, array *, fourcc_t, nodeenumclassfilterrated, void *)"
                         );
          }
          b = (nodeclassrated *)ListId->_Begin;
          for (Count = (size_t)_BestPri;
              (char *)Count != _BestPri + ((ulong)List._Begin & 0xfffffffffffffff0);
              Count = Count + 0x10) {
            *(undefined4 *)&b->Class = *(undefined4 *)(*(long *)Count + 0x50);
            b = (nodeclassrated *)((long)&b->Class + 4);
          }
        }
        ArrayClear((array *)&BestPri);
      }
      return BestRate;
    }
    if ((-1 < *(char *)(*(long *)List._Used + 0x3d)) &&
       ((*(byte *)(*(long *)List._Used + 0x3c) & 8) == 0)) {
      for (i = *(nodeclass ***)List._Used; i != (nodeclass **)0x0; i = (nodeclass **)i[3]) {
        if (*(fourcc_t *)(i + 10) == ClassId) {
          if (Func == (nodeenumclassfilterrated)0x0) {
            local_ac = 1;
          }
          else {
            local_ac = (*Func)(Param,*(nodeclass **)List._Used);
          }
          Item.Rating = local_ac;
          if (0 < local_ac) {
            if (ListId == (array *)0x0) {
              if (((int)Item._12_4_ < local_ac) ||
                 ((Item._12_4_ == local_ac && (Rating < *(short *)(*(long *)List._Used + 0x3e))))) {
                BestRate = *(int *)(*(long *)List._Used + 0x50);
                Rating = (int)*(short *)(*(long *)List._Used + 0x3e);
                Item._12_4_ = local_ac;
              }
            }
            else {
              a = *(fourcc_t **)List._Used;
              Item.Class._0_4_ = local_ac;
              ArrayAppend((array *)&BestPri,&a,0x10,0x40);
            }
          }
          break;
        }
      }
    }
    List._Used = List._Used + 8;
  } while( true );
}

Assistant:

fourcc_t NodeEnumClassFilterRated(anynode* AnyContext, array* ListId, fourcc_t ClassId, nodeenumclassfilterrated Func, void* Param)
{
    nodecontext* p;
    const nodeclass* v;
    const nodeclass **i;
    array List;

    fourcc_t BestId = 0;
    int BestPri = 0;
    int BestRate = 0;

    assert(AnyContext != NULL);
    p = Node_Context(AnyContext);

    ArrayInit(&List);

    for (i=ARRAYBEGIN(p->NodeClass,const nodeclass*);i!=ARRAYEND(p->NodeClass,const nodeclass*);++i)
    {
        if ((*i)->State>=CLASS_REGISTERED && !((*i)->Flags & CFLAG_ABSTRACT)) // skip abstract
        {
            for (v=*i;v;v=v->ParentClass)
                if (NodeClass_ClassId(v) == ClassId)
                {
                    int Rating = Func ? Func(Param,*i):1;
                    if (Rating > 0)
                    {
                        if (!ListId)
                        {
                            if (BestRate < Rating || (BestRate == Rating && BestPri < (*i)->Priority))
                            {
                                BestId = NodeClass_ClassId(*i);
                                BestPri = (*i)->Priority;
                                BestRate = Rating;
                            }
                        }
                        else
                        {
                            nodeclassrated Item;
                            Item.Class = *i;
                            Item.Rating = Rating;
                            ArrayAppend(&List,&Item,sizeof(Item),64);
                        }
                    }
                    break;
                }
        }
    }

    if (ListId)
    {
        fourcc_t* a;
        nodeclassrated* b;
        size_t Count = ARRAYCOUNT(List,nodeclassrated);
        ArraySort(&List,nodeclassrated,CmpRatedClassPri, NULL, 0);

        ArrayInit(ListId);
        if (ArrayAppend(ListId,NULL,Count*sizeof(fourcc_t),64))
        {
            for (a=ARRAYBEGIN(*ListId,fourcc_t),b=ARRAYBEGIN(List,nodeclassrated);b!=ARRAYEND(List,nodeclassrated);++b,++a)
                *a = NodeClass_ClassId(b->Class);
        }
        ArrayClear(&List);
    }

    return BestId;
}